

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

double bsc_costs_std_1phase_put(bsc_group_t group,bsc_coll_params_t *set,bsc_size_t n)

{
  double dVar1;
  int local_3c;
  double local_38;
  double costs;
  bsc_pid_t P;
  group_t *g;
  bsc_size_t i;
  bsc_size_t n_local;
  bsc_coll_params_t *set_local;
  bsc_group_t group_local;
  
  if (group == (bsc_group_t)0x0) {
    local_3c = bsp_nprocs();
  }
  else {
    local_3c = *group;
  }
  local_38 = bsc_L(BSC_PUT);
  for (g._0_4_ = 0; (int)g < n; g._0_4_ = (int)g + 1) {
    dVar1 = bsc_g(BSC_PUT,set[(int)g].size);
    local_38 = dVar1 * (double)local_3c * (double)set[(int)g].size + local_38;
  }
  return local_38;
}

Assistant:

double bsc_costs_std_1phase_put( bsc_group_t group,
         bsc_coll_params_t * set, bsc_size_t n )
{
    bsc_size_t i;
    group_t * g = group;
    bsc_pid_t P = g?g->size:bsp_nprocs() ;
    double costs = bsc_L(BSC_PUT);
    for ( i = 0; i < n ; ++i )
        costs += bsc_g(BSC_PUT, set[i].size) * P * set[i].size;

    return costs;
}